

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

IdWithExprCoverageBinInitializerSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IdWithExprCoverageBinInitializerSyntax,slang::parsing::Token,slang::syntax::WithClauseSyntax&>
          (BumpAllocator *this,Token *args,WithClauseSyntax *args_1)

{
  Token id;
  IdWithExprCoverageBinInitializerSyntax *pIVar1;
  BumpAllocator *in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pIVar1 = (IdWithExprCoverageBinInitializerSyntax *)
           allocate(in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  id.info = in_RSI;
  id._0_8_ = in_RDX;
  slang::syntax::IdWithExprCoverageBinInitializerSyntax::IdWithExprCoverageBinInitializerSyntax
            ((IdWithExprCoverageBinInitializerSyntax *)in_RSI->location,id,
             (WithClauseSyntax *)in_RSI->rawTextPtr);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }